

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

_Bool fy_node_compare_user
                (fy_node *fyn1,fy_node *fyn2,fy_node_mapping_sort_fn sort_fn,void *sort_fn_arg,
                fy_node_scalar_compare_fn cmp_fn,void *cmp_fn_arg)

{
  fy_node_pair *pfVar1;
  fy_node_pair *pfVar2;
  fy_node *pfVar3;
  fy_node *pfVar4;
  uint count;
  fy_node_pair **arg;
  byte bVar5;
  _Bool _Var6;
  uint count_00;
  int iVar7;
  size_t sVar8;
  fy_token *pfVar9;
  fy_node_pair **fynpp;
  byte bVar10;
  _Bool _Var11;
  code *pcVar12;
  fy_token *fyn2_00;
  fy_node_pair **fynpp_00;
  ulong uVar13;
  fy_token *fyn1_00;
  bool bVar14;
  bool bVar15;
  fy_node_pair *pfStack_60;
  fy_node_pair *local_58;
  void *pvStack_50;
  uint local_44;
  fy_node_pair **local_40;
  fy_node *local_38;
  
  if (cmp_fn == (fy_node_scalar_compare_fn)0x0) {
    cmp_fn_arg = (void *)0x0;
  }
  pcVar12 = fy_node_scalar_cmp_default;
  if (cmp_fn != (fy_node_scalar_compare_fn)0x0) {
    pcVar12 = cmp_fn;
  }
  if (sort_fn == (fy_node_mapping_sort_fn)0x0) {
    sort_fn_arg = &local_58;
    sort_fn = fy_node_mapping_sort_cmp_default;
    local_58 = (fy_node_pair *)pcVar12;
    pvStack_50 = cmp_fn_arg;
  }
  else {
    local_58 = (fy_node_pair *)0x0;
    pvStack_50 = (void *)0x0;
  }
  if (fyn1 == fyn2) {
    return true;
  }
  bVar15 = true;
  bVar14 = true;
  if (fyn1 != (fy_node *)0x0) {
    if ((fyn1->field_0x34 & 3) == 0) {
      pfStack_60 = (fy_node_pair *)0x11d9cf;
      local_40 = (fy_node_pair **)sort_fn_arg;
      local_38 = fyn2;
      sVar8 = fy_token_get_text_length((fyn1->field_12).scalar);
      bVar14 = sVar8 == 0;
      sort_fn_arg = local_40;
      fyn2 = local_38;
    }
    else {
      bVar14 = false;
    }
  }
  if (fyn2 != (fy_node *)0x0) {
    if ((fyn2->field_0x34 & 3) == 0) {
      pfStack_60 = (fy_node_pair *)0x11da04;
      local_40 = (fy_node_pair **)sort_fn_arg;
      local_38 = fyn2;
      sVar8 = fy_token_get_text_length((fyn2->field_12).scalar);
      bVar15 = sVar8 == 0;
      sort_fn_arg = local_40;
      fyn2 = local_38;
    }
    else {
      bVar15 = false;
    }
  }
  _Var6 = true;
  if ((bool)(bVar14 & bVar15)) {
    return true;
  }
  if (!bVar14 && !bVar15) {
    bVar10 = fyn1->field_0x34 & 3;
    bVar5 = fyn2->field_0x34 & 3;
    if (bVar10 == bVar5) {
      switch(bVar10) {
      case 0:
        bVar15 = false;
        if ((fyn1 != (fy_node *)0x0) && (bVar10 == 0)) {
          bVar15 = fyn1->style == FYNS_ALIAS;
        }
        if (bVar5 == 0 && fyn2 != (fy_node *)0x0) {
          bVar14 = fyn2->style == FYNS_ALIAS;
        }
        else {
          bVar14 = false;
        }
        if (bVar15 == bVar14) {
          pfStack_60 = (fy_node_pair *)0x11dc1d;
          iVar7 = (*pcVar12)(fyn1,fyn2,cmp_fn_arg);
          return iVar7 == 0;
        }
        break;
      case 1:
        pfVar9 = (fy_token *)0x0;
        fyn1_00 = (fyn1->field_12).scalar;
        if ((fyn1->field_12).scalar == (fy_token *)&fyn1->field_12) {
          fyn1_00 = pfVar9;
        }
        fyn2_00 = (fyn2->field_12).scalar;
        if ((fyn2->field_12).scalar == (fy_token *)&fyn2->field_12) {
          fyn2_00 = pfVar9;
        }
        if (fyn2_00 == (fy_token *)0x0 || fyn1_00 == (fy_token *)0x0) {
          _Var6 = true;
        }
        else {
          do {
            pfStack_60 = (fy_node_pair *)0x11dad8;
            _Var6 = fy_node_compare_user
                              ((fy_node *)fyn1_00,(fy_node *)fyn2_00,(fy_node_mapping_sort_fn)0x0,
                               (void *)0x0,(fy_node_scalar_compare_fn)0x0,(void *)0x0);
            if (!_Var6) {
              pfVar9 = (fy_token *)(ulong)_Var6;
              goto LAB_0011dc27;
            }
            fyn1_00 = (fy_token *)(fyn1_00->node).next;
            if (fyn1_00 == (fy_token *)&fyn1->field_12) {
              fyn1_00 = (fy_token *)0x0;
            }
            fyn2_00 = (fy_token *)(fyn2_00->node).next;
            if (fyn2_00 == (fy_token *)&fyn2->field_12) {
              fyn2_00 = (fy_token *)0x0;
            }
          } while ((fyn1_00 != (fy_token *)0x0) && (fyn2_00 != (fy_token *)0x0));
          pfVar9 = (fy_token *)0x0;
        }
LAB_0011dc27:
        _Var11 = SUB81(pfVar9,0);
        if (fyn1_00 == fyn2_00) {
          _Var11 = _Var6;
        }
        if (_Var6 == false) {
          return false;
        }
        return _Var11;
      case 2:
        pfStack_60 = (fy_node_pair *)0x11db1e;
        local_40 = (fy_node_pair **)sort_fn_arg;
        count_00 = fy_node_mapping_item_count(fyn1);
        pfStack_60 = (fy_node_pair *)0x11db29;
        local_44 = fy_node_mapping_item_count(fyn2);
        arg = local_40;
        if (count_00 == local_44) {
          fynpp = (fy_node_pair **)
                  ((long)&local_58 - ((long)(int)count_00 * 8 + 0x17U & 0xfffffffffffffff0));
          fynpp_00 = (fy_node_pair **)
                     ((long)fynpp - ((long)(int)local_44 * 8 + 0x17U & 0xfffffffffffffff0));
          local_38 = (fy_node *)fynpp;
          fynpp_00[-1] = (fy_node_pair *)0x11db7e;
          fy_node_mapping_perform_sort(fyn1,sort_fn,arg,fynpp,count_00);
          count = local_44;
          fynpp_00[-1] = (fy_node_pair *)0x11db93;
          fy_node_mapping_perform_sort(fyn2,sort_fn,arg,fynpp_00,count);
          if ((int)count_00 < 1) {
            return true;
          }
          uVar13 = 0;
          while( true ) {
            pfVar1 = *(fy_node_pair **)((long)local_38 + uVar13 * 8);
            pfVar2 = fynpp_00[uVar13];
            pfVar3 = pfVar1->key;
            pfVar4 = pfVar2->key;
            fynpp_00[-1] = (fy_node_pair *)0x11dbc3;
            _Var6 = fy_node_compare_user
                              (pfVar3,pfVar4,(fy_node_mapping_sort_fn)0x0,(void *)0x0,
                               (fy_node_scalar_compare_fn)0x0,(void *)0x0);
            if (!_Var6) {
              return _Var6;
            }
            pfVar3 = pfVar1->value;
            pfVar4 = pfVar2->value;
            fynpp_00[-1] = (fy_node_pair *)0x11dbdf;
            _Var6 = fy_node_compare_user
                              (pfVar3,pfVar4,(fy_node_mapping_sort_fn)0x0,(void *)0x0,
                               (fy_node_scalar_compare_fn)0x0,(void *)0x0);
            if (!_Var6) break;
            uVar13 = uVar13 + 1;
            if (count_00 == uVar13) {
              return true;
            }
          }
          return _Var6;
        }
        break;
      case 3:
        goto switchD_0011da54_caseD_3;
      }
    }
  }
  _Var6 = false;
switchD_0011da54_caseD_3:
  return _Var6;
}

Assistant:

bool fy_node_compare_user(struct fy_node *fyn1, struct fy_node *fyn2,
                          fy_node_mapping_sort_fn sort_fn, void *sort_fn_arg,
                          fy_node_scalar_compare_fn cmp_fn, void *cmp_fn_arg) {
    struct fy_node *fyni1, *fyni2;
    struct fy_node_pair *fynp1, *fynp2;
    bool ret, null1, null2;
    struct fy_node_pair **fynpp1, **fynpp2;
    int i, count1, count2;
    bool alias1, alias2;
    struct fy_node_cmp_arg def_arg;

    if (!cmp_fn) {
        cmp_fn = fy_node_scalar_cmp_default;
        cmp_fn_arg = NULL;
    }
    if (!sort_fn) {
        sort_fn = fy_node_mapping_sort_cmp_default;
        def_arg.cmp_fn = cmp_fn;
        def_arg.arg = cmp_fn_arg;
        sort_fn_arg = &def_arg;
    } else {
        def_arg.cmp_fn = NULL;
        def_arg.arg = NULL;
    }
    /* equal pointers? */
    if (fyn1 == fyn2)
        return true;

    null1 = !fyn1 || (fyn1->type == FYNT_SCALAR && fy_token_get_text_length(fyn1->scalar) == 0);
    null2 = !fyn2 || (fyn2->type == FYNT_SCALAR && fy_token_get_text_length(fyn2->scalar) == 0);

    /* both null */
    if (null1 && null2)
        return true;

    /* either is NULL, no match */
    if (null1 || null2)
        return false;

    /* types must match */
    if (fyn1->type != fyn2->type)
        return false;

    ret = true;

    switch (fyn1->type) {
        case FYNT_SEQUENCE:
            fyni1 = fy_node_list_head(&fyn1->sequence);
            fyni2 = fy_node_list_head(&fyn2->sequence);
            while (fyni1 && fyni2) {

                ret = fy_node_compare(fyni1, fyni2);
                if (!ret)
                    break;

                fyni1 = fy_node_next(&fyn1->sequence, fyni1);
                fyni2 = fy_node_next(&fyn2->sequence, fyni2);
            }
            if (ret && fyni1 != fyni2 && (!fyni1 || !fyni2))
                ret = false;

            break;

        case FYNT_MAPPING:
            count1 = fy_node_mapping_item_count(fyn1);
            count2 = fy_node_mapping_item_count(fyn2);

            /* mapping counts must match */
            if (count1 != count2) {
                ret = false;
                break;
            }

            fynpp1 = alloca(sizeof(*fynpp1) * (count1 + 1));
            fynpp2 = alloca(sizeof(*fynpp2) * (count2 + 1));

            fy_node_mapping_perform_sort(fyn1, sort_fn, sort_fn_arg, fynpp1, count1);
            fy_node_mapping_perform_sort(fyn2, sort_fn, sort_fn_arg, fynpp2, count2);

            for (i = 0; i < count1; i++) {
                fynp1 = fynpp1[i];
                fynp2 = fynpp2[i];

                ret = fy_node_compare(fynp1->key, fynp2->key);
                if (!ret)
                    break;

                ret = fy_node_compare(fynp1->value, fynp2->value);
                if (!ret)
                    break;
            }
            if (i >= count1)
                ret = true;

            break;

        case FYNT_SCALAR:
            alias1 = fy_node_is_alias(fyn1);
            alias2 = fy_node_is_alias(fyn2);

            /* either both must be aliases or both not */
            if (alias1 != alias2)
                return false;

            ret = !cmp_fn(fyn1, fyn2, cmp_fn_arg);
            break;
    }

    return ret;
}